

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::AllocLarge(PageHeap *this,Length n)

{
  Span *pSVar1;
  Span *pSVar2;
  bool bVar3;
  pointer pSVar4;
  PageHeap *local_c8;
  Span *c;
  SpanPtrWithLength local_98;
  _Base_ptr local_88;
  _Self local_80;
  SpanPtrWithLength local_78;
  _Self local_68;
  SpanSetIter place;
  Span bound;
  Span *best_normal;
  Span *best;
  Length n_local;
  PageHeap *this_local;
  
  best_normal = (Span *)0x0;
  Span::Span((Span *)&place);
  place._M_node = (_Base_ptr)0x0;
  SpanPtrWithLength::SpanPtrWithLength(&local_78,(Span *)&place);
  local_68._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
       ::upper_bound(&this->large_normal_,&local_78);
  local_80._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
       ::end(&this->large_normal_);
  bVar3 = std::operator!=(&local_68,&local_80);
  if (bVar3) {
    pSVar4 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->(&local_68);
    best_normal = pSVar4->span;
  }
  pSVar2 = best_normal;
  SpanPtrWithLength::SpanPtrWithLength(&local_98,(Span *)&place);
  local_88 = (_Base_ptr)
             std::
             set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
             ::upper_bound(&this->large_returned_,&local_98);
  local_68._M_node = local_88;
  c = (Span *)std::
              set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
              ::end(&this->large_returned_);
  bVar3 = std::operator!=(&local_68,(_Self *)&c);
  if (bVar3) {
    pSVar4 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->(&local_68);
    pSVar1 = pSVar4->span;
    if (((best_normal == (Span *)0x0) || (pSVar1->length < best_normal->length)) ||
       ((pSVar1->length == best_normal->length && (pSVar1->start < best_normal->start)))) {
      pSVar4 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->(&local_68);
      best_normal = pSVar4->span;
    }
  }
  if (best_normal == pSVar2) {
    if (best_normal == (Span *)0x0) {
      local_c8 = (PageHeap *)0x0;
    }
    else {
      local_c8 = (PageHeap *)Carve(this,best_normal,n);
    }
    this_local = local_c8;
  }
  else {
    bVar3 = EnsureLimit(this,n,false);
    if (bVar3) {
      this_local = (PageHeap *)Carve(this,best_normal,n);
    }
    else {
      bVar3 = EnsureLimit(this,n,true);
      if (bVar3) {
        this_local = (PageHeap *)AllocLarge(this,n);
      }
      else {
        this_local = (PageHeap *)0x0;
      }
    }
  }
  return (Span *)this_local;
}

Assistant:

Span* PageHeap::AllocLarge(Length n) {
  ASSERT(lock_.IsHeld());
  Span *best = nullptr;
  Span *best_normal = nullptr;

  // Create a Span to use as an upper bound.
  Span bound;
  bound.start = 0;
  bound.length = n;

  // First search the NORMAL spans..
  SpanSetIter place = large_normal_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_normal_.end()) {
    best = place->span;
    best_normal = best;
    ASSERT(best->location == Span::ON_NORMAL_FREELIST);
  }

  // Try to find better fit from RETURNED spans.
  place = large_returned_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_returned_.end()) {
    Span *c = place->span;
    ASSERT(c->location == Span::ON_RETURNED_FREELIST);
    if (best_normal == nullptr
        || c->length < best->length
        || (c->length == best->length && c->start < best->start))
      best = place->span;
  }

  if (best == best_normal) {
    return best == nullptr ? nullptr : Carve(best, n);
  }

  // best comes from RETURNED set.

  if (EnsureLimit(n, false)) {
    return Carve(best, n);
  }

  if (EnsureLimit(n, true)) {
    // best could have been destroyed by coalescing.
    // best_normal is not a best-fit, and it could be destroyed as well.
    // We retry, the limit is already ensured:
    return AllocLarge(n);
  }

  // If best_normal existed, EnsureLimit would succeeded:
  ASSERT(best_normal == nullptr);
  // We are not allowed to take best from returned list.
  return nullptr;
}